

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTestCase.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_0::BufferBindingValidator::validateSingleBlock
          (BufferBindingValidator *this,InterfaceBlock *block,
          vector<int,_std::allocator<int>_> *instanceIndex,string *resource,GLint propValue,
          string *implementationName)

{
  int iVar1;
  bool bVar2;
  size_type sVar3;
  const_reference pvVar4;
  TestLog *pTVar5;
  MessageBuilder *pMVar6;
  int local_6b8;
  allocator<char> local_6a1;
  string local_6a0;
  MessageBuilder local_680;
  MessageBuilder local_500;
  allocator<char> local_379;
  string local_378;
  MessageBuilder local_358;
  MessageBuilder local_1c8;
  int local_48;
  int local_44;
  int expected;
  int dimensionNdx;
  int dimensionSize;
  int flatIndex;
  string *implementationName_local;
  string *psStack_28;
  GLint propValue_local;
  string *resource_local;
  vector<int,_std::allocator<int>_> *instanceIndex_local;
  InterfaceBlock *block_local;
  BufferBindingValidator *this_local;
  
  _dimensionSize = implementationName;
  implementationName_local._4_4_ = propValue;
  psStack_28 = resource;
  resource_local = (string *)instanceIndex;
  instanceIndex_local = (vector<int,_std::allocator<int>_> *)block;
  block_local = (InterfaceBlock *)this;
  if ((block->layout).binding == -1) {
    pTVar5 = tcu::TestContext::getLog
                       ((this->super_SingleBlockValidator).super_PropValidator.m_testCtx);
    tcu::TestLog::operator<<(&local_500,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<
                       (&local_500,
                        (char (*) [52])"Verifying buffer binding, expecting a valid binding");
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_500);
    if (implementationName_local._4_4_ < 0) {
      pTVar5 = tcu::TestContext::getLog
                         ((this->super_SingleBlockValidator).super_PropValidator.m_testCtx);
      tcu::TestLog::operator<<(&local_680,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar6 = tcu::MessageBuilder::operator<<
                         (&local_680,(char (*) [37])"\tError, invalid buffer binding, got ");
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(int *)((long)&implementationName_local + 4));
      tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_680);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_6a0,"buffer binding invalid",&local_6a1);
      PropValidator::setError((PropValidator *)this,&local_6a0);
      std::__cxx11::string::~string((string *)&local_6a0);
      std::allocator<char>::~allocator(&local_6a1);
    }
  }
  else {
    dimensionNdx = 0;
    expected = 1;
    sVar3 = std::vector<int,_std::allocator<int>_>::size(&block->dimensions);
    local_44 = (int)sVar3;
    while (iVar1 = expected, local_44 = local_44 + -1, -1 < local_44) {
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)resource_local,(long)local_44);
      dimensionNdx = iVar1 * *pvVar4 + dimensionNdx;
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         (instanceIndex_local + 5,(long)local_44);
      expected = *pvVar4 * expected;
    }
    bVar2 = std::vector<int,_std::allocator<int>_>::empty(instanceIndex_local + 5);
    if (bVar2) {
      local_6b8 = *(int *)((long)&(instanceIndex_local->
                                  super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                  super__Vector_impl_data._M_start + 4);
    }
    else {
      local_6b8 = *(int *)((long)&(instanceIndex_local->
                                  super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                  super__Vector_impl_data._M_start + 4) + dimensionNdx;
    }
    local_48 = local_6b8;
    pTVar5 = tcu::TestContext::getLog
                       ((this->super_SingleBlockValidator).super_PropValidator.m_testCtx);
    tcu::TestLog::operator<<(&local_1c8,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<
                       (&local_1c8,(char (*) [36])"Verifying block binding, expecting ");
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_48);
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1c8);
    if (implementationName_local._4_4_ != local_48) {
      pTVar5 = tcu::TestContext::getLog
                         ((this->super_SingleBlockValidator).super_PropValidator.m_testCtx);
      tcu::TestLog::operator<<(&local_358,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar6 = tcu::MessageBuilder::operator<<
                         (&local_358,(char (*) [37])"\tError, invalid buffer binding, got ");
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(int *)((long)&implementationName_local + 4));
      tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_358);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_378,"buffer binding invalid",&local_379);
      PropValidator::setError((PropValidator *)this,&local_378);
      std::__cxx11::string::~string((string *)&local_378);
      std::allocator<char>::~allocator(&local_379);
    }
  }
  return;
}

Assistant:

void BufferBindingValidator::validateSingleBlock (const glu::InterfaceBlock& block, const std::vector<int>& instanceIndex, const std::string& resource, glw::GLint propValue, const std::string& implementationName) const
{
	DE_UNREF(resource);
	DE_UNREF(implementationName);

	if (block.layout.binding != -1)
	{
		int flatIndex		= 0;
		int dimensionSize	= 1;

		for (int dimensionNdx = (int)(block.dimensions.size()) - 1; dimensionNdx >= 0; --dimensionNdx)
		{
			flatIndex += dimensionSize * instanceIndex[dimensionNdx];
			dimensionSize *= block.dimensions[dimensionNdx];
		}

		const int expected = (block.dimensions.empty()) ? (block.layout.binding) : (block.layout.binding + flatIndex);
		m_testCtx.getLog() << tcu::TestLog::Message << "Verifying block binding, expecting " << expected << tcu::TestLog::EndMessage;

		if (propValue != expected)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "\tError, invalid buffer binding, got " << propValue << tcu::TestLog::EndMessage;
			setError("buffer binding invalid");
		}
	}
	else
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Verifying buffer binding, expecting a valid binding" << tcu::TestLog::EndMessage;

		if (propValue < 0)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "\tError, invalid buffer binding, got " << propValue << tcu::TestLog::EndMessage;
			setError("buffer binding invalid");
		}
	}
}